

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O0

string * to_string_abi_cxx11_(string *__return_storage_ptr__,Compress *compression)

{
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  Compress *local_18;
  Compress *compression_local;
  
  local_18 = compression;
  compression_local = (Compress *)__return_storage_ptr__;
  switch(*compression) {
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"none",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case Zip:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"zip",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case Gzip:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"gzip",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case Bzip2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"bzip2",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case Xz:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"xz",&local_30);
    std::allocator<char>::~allocator(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Compress& compression)
{
    switch (compression)
    {
    default:
    case Compress::None:    return "none";
    case Compress::Zip:     return "zip";
    case Compress::Gzip:    return "gzip";
    case Compress::Bzip2:   return "bzip2";
    case Compress::Xz:      return "xz";
    }
}